

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::BaseCompiler::addFuncNode
          (BaseCompiler *this,FuncNode **out,FuncSignature *signature)

{
  char *__s;
  FuncNode *pFVar1;
  Error EVar2;
  int iVar3;
  undefined4 extraout_var;
  
  __s = (this->super_BaseBuilder).super_BaseEmitter._inlineComment;
  (this->super_BaseBuilder).super_BaseEmitter._instOptions = kNone;
  (this->super_BaseBuilder).super_BaseEmitter._extraReg._signature = 0;
  *(undefined8 *)&(this->super_BaseBuilder).super_BaseEmitter._extraReg._id = 0;
  *(undefined4 *)((long)&(this->super_BaseBuilder).super_BaseEmitter._inlineComment + 4) = 0;
  EVar2 = newFuncNode(this,out,signature);
  if (EVar2 == 0) {
    if (__s != (char *)0x0) {
      pFVar1 = *out;
      strlen(__s);
      iVar3 = Zone::dup(&(this->super_BaseBuilder)._dataZone,(int)__s);
      (pFVar1->super_LabelNode).super_BaseNode._inlineComment = (char *)CONCAT44(extraout_var,iVar3)
      ;
    }
    addFunc(this,*out);
  }
  return EVar2;
}

Assistant:

Error BaseCompiler::addFuncNode(FuncNode** out, const FuncSignature& signature) {
  State state = _grabState();

  ASMJIT_PROPAGATE(newFuncNode(out, signature));
  ASMJIT_ASSUME(*out != nullptr);

  BaseBuilder_assignInlineComment(this, *out, state.comment);

  addFunc(*out);
  return kErrorOk;
}